

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

void __thiscall MetaCommand::MetaCommand(MetaCommand *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40);
  std::__cxx11::string::string(in_RDI + 0x60);
  std::__cxx11::string::string(in_RDI + 0x80);
  std::__cxx11::string::string(in_RDI + 0xa0);
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::vector
            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)0x1256f8);
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::vector
            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)0x12570e);
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::clear
            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)0x125728);
  std::__cxx11::string::operator=(in_RDI,"Not defined");
  std::__cxx11::string::operator=(in_RDI + 0x20,"Not defined");
  std::__cxx11::string::operator=(in_RDI + 0x40,"");
  std::__cxx11::string::operator=(in_RDI + 0x80,"Not defined");
  std::__cxx11::string::operator=(in_RDI + 0x60,"");
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::clear
            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)0x1257a8);
  in_RDI[0xf8] = (string)0x1;
  return;
}

Assistant:

MetaCommand::MetaCommand()
{
  m_HelpCallBack = nullptr;
  m_OptionVector.clear();
  m_Version = "Not defined";
  m_Date = "Not defined";
  m_Name = "";
  m_Author = "Not defined";
  m_Description = "";
  m_ParsedOptionVector.clear();
  m_Verbose = true;
}